

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O1

void anon_unknown.dwarf_184020::doReadWriteManifest(IDManifest *mfst,string *fn,bool dump)

{
  _Base_ptr *pp_Var1;
  char *pcVar2;
  void *pvVar3;
  undefined8 uVar4;
  char cVar5;
  int iVar6;
  undefined4 *puVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  *this;
  Header *pHVar11;
  int *piVar12;
  ostream *poVar13;
  CompressedIDManifest *pCVar14;
  size_type __n;
  vector<char,_std::allocator<char>_> compressed;
  ChannelList chans;
  size_t compressedDataSize;
  InputFile in;
  IDManifest read;
  Header h;
  ostringstream str;
  ios_base local_138 [264];
  
  _str = 0;
  Imf_3_2::Header::Header(&h,0x40,0x40,1.0,(Vec2 *)&str,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_2::CompressedIDManifest::CompressedIDManifest((CompressedIDManifest *)&str,mfst);
  Imf_3_2::addIDManifest(&h,(CompressedIDManifest *)&str);
  Imf_3_2::CompressedIDManifest::~CompressedIDManifest((CompressedIDManifest *)&str);
  puVar7 = (undefined4 *)Imf_3_2::Header::dataWindow();
  *puVar7 = 0;
  lVar8 = Imf_3_2::Header::dataWindow();
  *(undefined4 *)(lVar8 + 4) = 0;
  lVar8 = Imf_3_2::Header::dataWindow();
  *(undefined4 *)(lVar8 + 8) = 0;
  lVar8 = Imf_3_2::Header::dataWindow();
  *(undefined4 *)(lVar8 + 0xc) = 0;
  puVar9 = (undefined8 *)Imf_3_2::Header::dataWindow();
  puVar10 = (undefined8 *)Imf_3_2::Header::displayWindow();
  *puVar10 = *puVar9;
  puVar10[1] = puVar9[1];
  chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &chans._map._M_t._M_impl.super__Rb_tree_header._M_header;
  chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  chans._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Channel::Channel((Channel *)&str,UINT,1,1,false);
  Imf_3_2::ChannelList::insert((char *)&chans,(Channel *)0x1bcac1);
  this = (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
          *)Imf_3_2::Header::channels();
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  ::operator=(this,(_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
                    *)&chans);
  pcVar2 = (fn->_M_dataplus)._M_p;
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::OutputFile::OutputFile((OutputFile *)&compressed,pcVar2,&h,iVar6);
  read._manifest.
  super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  read._manifest.
  super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _in = 1;
  Imf_3_2::Slice::Slice((Slice *)&str,UINT,(char *)&in,1,0,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&read,(Slice *)0x1bcac1);
  Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&compressed);
  Imf_3_2::OutputFile::writePixels((int)&compressed);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&read);
  Imf_3_2::OutputFile::~OutputFile((OutputFile *)&compressed);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
               *)&chans);
  pcVar2 = (fn->_M_dataplus)._M_p;
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile(&in,pcVar2,iVar6);
  pHVar11 = (Header *)Imf_3_2::InputFile::header();
  piVar12 = (int *)Imf_3_2::idManifest(pHVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"compression: ",0xd);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," --> ",5);
  std::ostream::operator<<(poVar13,*piVar12);
  std::ostream::flush();
  pHVar11 = (Header *)Imf_3_2::InputFile::header();
  pCVar14 = (CompressedIDManifest *)Imf_3_2::idManifest(pHVar11);
  Imf_3_2::IDManifest::IDManifest(&read,pCVar14);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  operator<<((ostream *)&str,&read);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," raw decoded size: ",0x13);
  std::__cxx11::stringbuf::str();
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&compressed,1);
  pp_Var1 = &chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((_Base_ptr *)CONCAT71(chans._map._M_t._M_impl._1_7_,chans._map._M_t._M_impl._0_1_) != pp_Var1)
  {
    operator_delete((undefined1 *)
                    CONCAT71(chans._map._M_t._M_impl._1_7_,chans._map._M_t._M_impl._0_1_),
                    (ulong)((long)&(chans._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  std::__cxx11::stringbuf::str();
  uVar4 = CONCAT44(chans._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                   chans._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
  if ((_Base_ptr *)CONCAT71(chans._map._M_t._M_impl._1_7_,chans._map._M_t._M_impl._0_1_) != pp_Var1)
  {
    operator_delete((undefined1 *)
                    CONCAT71(chans._map._M_t._M_impl._1_7_,chans._map._M_t._M_impl._0_1_),
                    (ulong)((long)&(chans._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  __n = exr_compress_max_buffer_size(uVar4);
  std::vector<char,_std::allocator<char>_>::vector(&compressed,__n,(allocator_type *)&chans);
  std::__cxx11::stringbuf::str();
  exr_compress_buffer(6,CONCAT71(chans._map._M_t._M_impl._1_7_,chans._map._M_t._M_impl._0_1_),uVar4,
                      CONCAT71(compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,
                               compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._0_1_),__n);
  if ((_Base_ptr *)CONCAT71(chans._map._M_t._M_impl._1_7_,chans._map._M_t._M_impl._0_1_) != pp_Var1)
  {
    operator_delete((undefined1 *)
                    CONCAT71(chans._map._M_t._M_impl._1_7_,chans._map._M_t._M_impl._0_1_),
                    (ulong)((long)&(chans._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"simple zip size: ",0x11)
  ;
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  chans._map._M_t._M_impl._0_1_ = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&chans,1);
  std::ostream::flush();
  if (dump) {
    operator<<((ostream *)&std::cout,&read);
  }
  cVar5 = Imf_3_2::IDManifest::operator!=(&read,mfst);
  if (cVar5 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"read manifest didn\'t match written manifest\n",0x2c);
  }
  remove((fn->_M_dataplus)._M_p);
  pvVar3 = (void *)CONCAT71(compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  std::ios_base::~ios_base(local_138);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&read._manifest);
  Imf_3_2::InputFile::~InputFile(&in);
  Imf_3_2::Header::~Header(&h);
  return;
}

Assistant:

void
doReadWriteManifest (const IDManifest& mfst, const string& fn, bool dump)
{
    Header h;
    addIDManifest (h, mfst);
    writeFile (h, fn);

    InputFile in (fn.c_str ());

    const CompressedIDManifest& cmpd = idManifest (in.header ());
    cerr << "compression: " << cmpd._uncompressedDataSize << " --> "
         << cmpd._compressedDataSize;
    cerr.flush ();

    IDManifest read = idManifest (in.header ());

    std::ostringstream str;
    str << read;

    cerr << " raw decoded size: " << str.str ().size () << ' ';

#define COMPARE_WITH_SIMPLE_ZIP
#ifdef COMPARE_WITH_SIMPLE_ZIP
    //
    // allocate a buffer which is guaranteed to be big enough for compression
    //
    size_t       sourceDataSize = str.str ().size ();
    size_t       compressedDataSize = exr_compress_max_buffer_size (sourceDataSize);
    vector<char> compressed (compressedDataSize);

    exr_compress_buffer (
        6,
        str.str ().c_str (),
        sourceDataSize,
        compressed.data (),
        compressedDataSize,
        &compressedDataSize);

    cerr << "simple zip size: " << compressedDataSize << ' ';
#endif

    cerr.flush ();
    if (dump) { cout << read; }
    if (read != mfst)
    {
        cerr << "read manifest didn't match written manifest\n";
        assert (read == mfst);
    }
    remove (fn.c_str ());
}